

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O2

void leopard::ff16::FFT_DIT2(void *x,void *y,ffe_t log_m,uint64_t bytes)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  byte bVar22;
  uint64_t uVar23;
  long lVar24;
  ushort uVar25;
  void *pvVar26;
  void *pvVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  
  if (CpuHasAVX2 == '\x01') {
    auVar40[8] = 0xf;
    auVar40._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar40[9] = 0xf;
    auVar40[10] = 0xf;
    auVar40[0xb] = 0xf;
    auVar40[0xc] = 0xf;
    auVar40[0xd] = 0xf;
    auVar40[0xe] = 0xf;
    auVar40[0xf] = 0xf;
    auVar40[0x10] = 0xf;
    auVar40[0x11] = 0xf;
    auVar40[0x12] = 0xf;
    auVar40[0x13] = 0xf;
    auVar40[0x14] = 0xf;
    auVar40[0x15] = 0xf;
    auVar40[0x16] = 0xf;
    auVar40[0x17] = 0xf;
    auVar40[0x18] = 0xf;
    auVar40[0x19] = 0xf;
    auVar40[0x1a] = 0xf;
    auVar40[0x1b] = 0xf;
    auVar40[0x1c] = 0xf;
    auVar40[0x1d] = 0xf;
    auVar40[0x1e] = 0xf;
    auVar40[0x1f] = 0xf;
    lVar24 = (ulong)log_m * 0x100;
    auVar12 = *(undefined1 (*) [32])(Multiply256LUT + lVar24);
    auVar13 = *(undefined1 (*) [32])(Multiply256LUT + 0x20 + lVar24);
    auVar14 = *(undefined1 (*) [32])(Multiply256LUT + 0x40 + lVar24);
    auVar15 = *(undefined1 (*) [32])(Multiply256LUT + 0x60 + lVar24);
    auVar16 = *(undefined1 (*) [32])(Multiply256LUT + 0x80 + lVar24);
    auVar17 = *(undefined1 (*) [32])(Multiply256LUT + 0xa0 + lVar24);
    auVar18 = *(undefined1 (*) [32])(Multiply256LUT + 0xc0 + lVar24);
    auVar19 = *(undefined1 (*) [32])(Multiply256LUT + 0xe0 + lVar24);
    uVar23 = 0;
    do {
      auVar20 = *(undefined1 (*) [32])((long)y + uVar23);
      auVar21 = *(undefined1 (*) [32])((long)y + uVar23 + 0x20);
      auVar42 = vpsrlq_avx2(auVar20,4);
      auVar38 = vpand_avx2(auVar20,auVar40);
      auVar34 = vpandq_avx512vl(auVar21,auVar40);
      auVar44 = vpsrlq_avx2(auVar21,4);
      auVar42 = vpand_avx2(auVar42,auVar40);
      auVar36 = vpshufb_avx2(auVar12,auVar38);
      auVar35 = vpshufb_avx512vl(auVar14,auVar34);
      auVar38 = vpshufb_avx2(auVar16,auVar38);
      auVar37 = vpshufb_avx2(auVar13,auVar42);
      auVar42 = vpshufb_avx2(auVar17,auVar42);
      auVar36 = vpternlogq_avx512vl(auVar35,auVar37,auVar36,0x96);
      auVar37 = vpshufb_avx512vl(auVar18,auVar34);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar42,auVar38,0x96);
      auVar38 = vpand_avx2(auVar44,auVar40);
      auVar42 = vpshufb_avx2(auVar15,auVar38);
      auVar38 = vpshufb_avx2(auVar19,auVar38);
      auVar42 = vpternlogq_avx512vl(auVar42,auVar36,*(undefined1 (*) [32])((long)x + uVar23),0x96);
      auVar38 = vpternlogq_avx512vl(auVar38,auVar37,*(undefined1 (*) [32])((long)x + uVar23 + 0x20),
                                    0x96);
      *(undefined1 (*) [32])((long)x + uVar23) = auVar42;
      *(undefined1 (*) [32])((long)x + uVar23 + 0x20) = auVar38;
      *(undefined1 (*) [32])((long)y + uVar23) = auVar42 ^ auVar20;
      *(undefined1 (*) [32])((long)y + uVar23 + 0x20) = auVar38 ^ auVar21;
      uVar23 = uVar23 + 0x40;
    } while (bytes != uVar23);
  }
  else {
    if (CpuHasSSSE3 != '\x01') {
      lVar24 = (ulong)log_m * 0x80 + Multiply16LUT;
      pvVar26 = x;
      pvVar27 = y;
      uVar23 = bytes;
      do {
        for (lVar28 = 0x20; lVar28 != 0x40; lVar28 = lVar28 + 1) {
          bVar22 = *(byte *)((long)pvVar27 + lVar28 + -0x20);
          uVar25 = *(ushort *)(lVar24 + 0x20 + (ulong)(bVar22 >> 4) * 2) ^
                   *(ushort *)(lVar24 + (ulong)(bVar22 & 0xf) * 2) ^
                   *(ushort *)(lVar24 + 0x40 + (ulong)(*(byte *)((long)pvVar27 + lVar28) & 0xf) * 2)
                   ^ *(ushort *)
                      (lVar24 + 0x60 + (ulong)(*(byte *)((long)pvVar27 + lVar28) >> 4) * 2);
          pbVar1 = (byte *)((long)pvVar26 + lVar28 + -0x20);
          *pbVar1 = *pbVar1 ^ (byte)uVar25;
          *(byte *)((long)pvVar26 + lVar28) =
               *(byte *)((long)pvVar26 + lVar28) ^ (byte)(uVar25 >> 8);
        }
        pvVar26 = (void *)((long)pvVar26 + 0x40);
        pvVar27 = (void *)((long)pvVar27 + 0x40);
        uVar23 = uVar23 - 0x40;
      } while (uVar23 != 0);
      xor_mem(y,x,bytes);
      return;
    }
    auVar39[8] = 0xf;
    auVar39._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar39[9] = 0xf;
    auVar39[10] = 0xf;
    auVar39[0xb] = 0xf;
    auVar39[0xc] = 0xf;
    auVar39[0xd] = 0xf;
    auVar39[0xe] = 0xf;
    auVar39[0xf] = 0xf;
    lVar24 = (ulong)log_m * 0x80;
    auVar2 = *(undefined1 (*) [16])(Multiply128LUT + lVar24);
    auVar3 = *(undefined1 (*) [16])(Multiply128LUT + 0x10 + lVar24);
    auVar4 = *(undefined1 (*) [16])(Multiply128LUT + 0x20 + lVar24);
    auVar5 = *(undefined1 (*) [16])(Multiply128LUT + 0x30 + lVar24);
    auVar6 = *(undefined1 (*) [16])(Multiply128LUT + 0x40 + lVar24);
    auVar7 = *(undefined1 (*) [16])(Multiply128LUT + 0x50 + lVar24);
    auVar8 = *(undefined1 (*) [16])(Multiply128LUT + 0x60 + lVar24);
    auVar9 = *(undefined1 (*) [16])(Multiply128LUT + 0x70 + lVar24);
    uVar23 = 0;
    do {
      auVar10 = *(undefined1 (*) [16])((long)y + uVar23 + 0x10);
      auVar11 = *(undefined1 (*) [16])((long)y + uVar23 + 0x30);
      auVar41 = vpsrlq_avx(auVar10,4);
      auVar33 = vpand_avx(auVar10,auVar39);
      auVar29 = vpandq_avx512vl(auVar11,auVar39);
      auVar43 = vpsrlq_avx(auVar11,4);
      auVar41 = vpand_avx(auVar41,auVar39);
      auVar31 = vpshufb_avx(auVar2,auVar33);
      auVar30 = vpshufb_avx512vl(auVar4,auVar29);
      auVar33 = vpshufb_avx(auVar6,auVar33);
      auVar32 = vpshufb_avx(auVar3,auVar41);
      auVar41 = vpshufb_avx(auVar7,auVar41);
      auVar31 = vpternlogq_avx512vl(auVar30,auVar32,auVar31,0x96);
      auVar32 = vpshufb_avx512vl(auVar8,auVar29);
      auVar32 = vpternlogq_avx512vl(auVar32,auVar41,auVar33,0x96);
      auVar33 = vpand_avx(auVar43,auVar39);
      auVar41 = vpshufb_avx(auVar5,auVar33);
      auVar33 = vpshufb_avx(auVar9,auVar33);
      auVar41 = vpternlogq_avx512vl(auVar41,auVar31,*(undefined1 (*) [16])((long)x + uVar23 + 0x10),
                                    0x96);
      auVar33 = vpternlogq_avx512vl(auVar33,auVar32,*(undefined1 (*) [16])((long)x + uVar23 + 0x30),
                                    0x96);
      *(undefined1 (*) [16])((long)x + uVar23 + 0x10) = auVar41;
      *(undefined1 (*) [16])((long)x + uVar23 + 0x30) = auVar33;
      *(undefined1 (*) [16])((long)y + uVar23 + 0x10) = auVar41 ^ auVar10;
      *(undefined1 (*) [16])((long)y + uVar23 + 0x30) = auVar33 ^ auVar11;
      auVar10 = *(undefined1 (*) [16])((long)y + uVar23);
      auVar11 = *(undefined1 (*) [16])((long)y + uVar23 + 0x20);
      auVar41 = vpsrlq_avx(auVar10,4);
      auVar33 = vpand_avx(auVar10,auVar39);
      auVar29 = vpandq_avx512vl(auVar11,auVar39);
      auVar43 = vpsrlq_avx(auVar11,4);
      auVar41 = vpand_avx(auVar41,auVar39);
      auVar31 = vpshufb_avx(auVar2,auVar33);
      auVar30 = vpshufb_avx512vl(auVar4,auVar29);
      auVar33 = vpshufb_avx(auVar6,auVar33);
      auVar32 = vpshufb_avx(auVar3,auVar41);
      auVar41 = vpshufb_avx(auVar7,auVar41);
      auVar31 = vpternlogq_avx512vl(auVar30,auVar32,auVar31,0x96);
      auVar32 = vpshufb_avx512vl(auVar8,auVar29);
      auVar32 = vpternlogq_avx512vl(auVar32,auVar41,auVar33,0x96);
      auVar33 = vpand_avx(auVar43,auVar39);
      auVar41 = vpshufb_avx(auVar5,auVar33);
      auVar33 = vpshufb_avx(auVar9,auVar33);
      auVar41 = vpternlogq_avx512vl(auVar41,auVar31,*(undefined1 (*) [16])((long)x + uVar23),0x96);
      auVar33 = vpternlogq_avx512vl(auVar33,auVar32,*(undefined1 (*) [16])((long)x + uVar23 + 0x20),
                                    0x96);
      *(undefined1 (*) [16])((long)x + uVar23) = auVar41;
      *(undefined1 (*) [16])((long)x + uVar23 + 0x20) = auVar33;
      *(undefined1 (*) [16])((long)y + uVar23) = auVar41 ^ auVar10;
      *(undefined1 (*) [16])((long)y + uVar23 + 0x20) = auVar33 ^ auVar11;
      uVar23 = uVar23 + 0x40;
    } while (bytes != uVar23);
  }
  return;
}

Assistant:

static void FFT_DIT2(
    void * LEO_RESTRICT x, void * LEO_RESTRICT y,
    ffe_t log_m, uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_MUL_TABLES_256(0, log_m);

        const LEO_M256 clr_mask = _mm256_set1_epi8(0x0f);

        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<LEO_M256 *>(y);

        do
        {
#define LEO_FFTB_256(x_ptr, y_ptr) { \
            LEO_M256 x_lo = _mm256_loadu_si256(x_ptr); \
            LEO_M256 x_hi = _mm256_loadu_si256(x_ptr + 1); \
            LEO_M256 y_lo = _mm256_loadu_si256(y_ptr); \
            LEO_M256 y_hi = _mm256_loadu_si256(y_ptr + 1); \
            LEO_MULADD_256(x_lo, x_hi, y_lo, y_hi, 0); \
            _mm256_storeu_si256(x_ptr, x_lo); \
            _mm256_storeu_si256(x_ptr + 1, x_hi); \
            y_lo = _mm256_xor_si256(y_lo, x_lo); \
            y_hi = _mm256_xor_si256(y_hi, x_hi); \
            _mm256_storeu_si256(y_ptr, y_lo); \
            _mm256_storeu_si256(y_ptr + 1, y_hi); }

            LEO_FFTB_256(x32, y32);
            y32 += 2, x32 += 2;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }
#endif // LEO_TRY_AVX2

    if (CpuHasSSSE3)
    {
        LEO_MUL_TABLES_128(0, log_m);

        const LEO_M128 clr_mask = _mm_set1_epi8(0x0f);

        LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
        LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<LEO_M128 *>(y);

        do
        {
#define LEO_FFTB_128(x_ptr, y_ptr) { \
                LEO_M128 x_lo = _mm_loadu_si128(x_ptr); \
                LEO_M128 x_hi = _mm_loadu_si128(x_ptr + 2); \
                LEO_M128 y_lo = _mm_loadu_si128(y_ptr); \
                LEO_M128 y_hi = _mm_loadu_si128(y_ptr + 2); \
                LEO_MULADD_128(x_lo, x_hi, y_lo, y_hi, 0); \
                _mm_storeu_si128(x_ptr, x_lo); \
                _mm_storeu_si128(x_ptr + 2, x_hi); \
                y_lo = _mm_xor_si128(y_lo, x_lo); \
                y_hi = _mm_xor_si128(y_hi, x_hi); \
                _mm_storeu_si128(y_ptr, y_lo); \
                _mm_storeu_si128(y_ptr + 2, y_hi); }

            LEO_FFTB_128(x16 + 1, y16 + 1);
            LEO_FFTB_128(x16, y16);
            x16 += 4, y16 += 4;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }

    // Reference version:
    RefMulAdd(x, y, log_m, bytes);
    xor_mem(y, x, bytes);
}